

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

StructSymbol * __thiscall StructTable::cSearch(StructTable *this,char *lexeme)

{
  bool bVar1;
  int iVar2;
  StructSymbol *this_00;
  
  if (lexeme != (char *)0x0) {
    for (this_00 = (StructSymbol *)SymbolTable::cSearch(&this->super_SymbolTable,lexeme);
        (this_00 != (StructSymbol *)0x0 &&
        ((this_00->super_Symbol).scope <= (this->super_SymbolTable).currentScope));
        this_00 = (StructSymbol *)(this_00->super_Symbol).nextSymbol) {
      iVar2 = strcmp((this->super_SymbolTable).lexemeArray + (this_00->super_Symbol).lexemeIndex,
                     lexeme);
      if ((iVar2 == 0) &&
         (bVar1 = Symbol::isScope(&this_00->super_Symbol,
                                  (this->super_SymbolTable).currentScopeLexeme), bVar1)) {
        return this_00;
      }
      bVar1 = Symbol::isScope(&this_00->super_Symbol,(this->super_SymbolTable).previousScopeLexeme);
      if (bVar1) {
        return this_00;
      }
      bVar1 = Symbol::isScope(&this_00->super_Symbol,"nonLocal");
      if (bVar1) {
        return this_00;
      }
    }
  }
  return (StructSymbol *)0x0;
}

Assistant:

StructSymbol *StructTable::cSearch(const char *lexeme) {
    if (lexeme != NULL) {
        StructSymbol *structSymbol = (StructSymbol *) SymbolTable::cSearch(lexeme);
        while (structSymbol != NULL && structSymbol->getScope() <= currentScope) {
            if ((!strcmp(lexemeArray + structSymbol->getLexemeIndex(), lexeme) &&
                 structSymbol->isScope(currentScopeLexeme)) ||
                structSymbol->isScope(previousScopeLexeme) || structSymbol->isScope("nonLocal")) {
                return structSymbol;
            }
            structSymbol = (StructSymbol *) structSymbol->getNextSymbol();
        }
    }
    return NULL;
}